

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_registry.hxx
# Opt level: O0

void cryptox::test::test_vector_registry<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>_>::
     test_vector(string *input,string *expected)

{
  undefined8 uVar1;
  bool bVar2;
  iterator d_first;
  lazy_ostream *prev;
  cryptox local_c0 [32];
  basic_cstring<const_char> local_a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_90;
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58 [2];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>_> local_28;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>_> digester;
  digest_type actual;
  string *expected_local;
  string *input_local;
  
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>_>::
  basic_message_digester(&local_28);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38._M_current = (char *)std::__cxx11::string::end();
  d_first = std::array<unsigned_char,_0UL>::begin
                      ((array<unsigned_char,_0UL> *)
                       ((long)&digester.
                               super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
                               ._context + 7));
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_md_null,0ul>>::operator()
            ((basic_message_digester<cryptox::message_digest_algorithm<&EVP_md_null,0ul>> *)
             &local_28,local_30,local_38,d_first);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
               ,0x7e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_68);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_58,0x2a,&local_68);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_90,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
               ,0x7e);
    to_hex<std::array<unsigned_char,0ul>>
              (local_c0,(array<unsigned_char,_0UL> *)
                        ((long)&digester.
                                super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
                                ._context + 7));
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_90,&local_a0,0x2a,1,2,local_c0,"to_hex(actual)",expected,"expected");
    std::__cxx11::string::~string((string *)local_c0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>_>::
  ~basic_message_digester(&local_28);
  return;
}

Assistant:

static void test_vector(const std::string& input,
		                        const std::string& expected) {

			typename Algorithm::digest_type actual;

			basic_message_digester<Algorithm> digester;
			digester(input.begin(), input.end(), actual.begin());

			BOOST_CHECK_EQUAL(to_hex(actual), expected);
		}